

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_free(ggml_context *ctx)

{
  long lVar1;
  long lVar2;
  
  ggml_critical_section_start();
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x60 == 0x1860) goto LAB_00117aa3;
    lVar1 = lVar2 + 0x60;
  } while ((ggml_context *)((long)&g_state.contexts[0].context.mem_size + lVar2) != ctx);
  (&g_state.contexts[0].used)[lVar2] = false;
  if (ctx->mem_buffer_owned == true) {
    free(ctx->mem_buffer);
  }
LAB_00117aa3:
  LOCK();
  g_state_barrier = g_state_barrier + -1;
  UNLOCK();
  return;
}

Assistant:

void ggml_free(struct ggml_context * ctx) {
    // make this function thread safe
    ggml_critical_section_start();

    bool found = false;

    for (int i = 0; i < GGML_MAX_CONTEXTS; i++) {
        if (&g_state.contexts[i].context == ctx) {
            g_state.contexts[i].used = false;

            GGML_PRINT_DEBUG("%s: context %d with %d objects has been freed. memory used = %zu\n",
                    __func__, i, ctx->n_objects, ctx->objects_end->offs + ctx->objects_end->size);

            if (ctx->mem_buffer_owned) {
                free(ctx->mem_buffer);
            }

            found = true;
            break;
        }
    }

    if (!found) {
        GGML_PRINT_DEBUG("%s: context not found\n", __func__);
    }

    ggml_critical_section_end();
}